

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.cc
# Opt level: O3

void __thiscall ArgParser::startQuack(ArgParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  string local_30;
  
  paVar1 = &local_30.field_2;
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"quack","");
  QPDFArgParser::selectOptionTable(&this->ap,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  bVar2 = QPDFArgParser::isCompleting(&this->ap);
  if (bVar2) {
    bVar2 = QPDFArgParser::isCompleting(&this->ap);
    if (bVar2) {
      iVar3 = QPDFArgParser::argsLeft(&this->ap);
      if (iVar3 == 0) {
        local_30._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"something","");
        QPDFArgParser::insertCompletion(&this->ap,&local_30);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_30._M_dataplus._M_p != paVar1) {
          operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
        }
        local_30._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"anything","");
        QPDFArgParser::insertCompletion(&this->ap,&local_30);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_30._M_dataplus._M_p != paVar1) {
          operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return;
}

Assistant:

void
ArgParser::startQuack()
{
    this->ap.selectOptionTable("quack");
    if (this->ap.isCompleting()) {
        if (this->ap.isCompleting() && (this->ap.argsLeft() == 0)) {
            this->ap.insertCompletion("something");
            this->ap.insertCompletion("anything");
        }
        return;
    }
}